

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorRK64.cpp
# Opt level: O0

int __thiscall pele::physics::reactions::ReactorRK64::init(ReactorRK64 *this,EVP_PKEY_CTX *ctx)

{
  ParmParse pp;
  int in_stack_ffffffffffffff4c;
  string *prefix;
  ParmParse *in_stack_ffffffffffffff60;
  undefined1 local_89 [85];
  int in_stack_ffffffffffffffcc;
  double *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  ParmParse *in_stack_ffffffffffffffe0;
  
  this->m_reactor_type = (int)ctx;
  ReactorTypes::check_reactor_type(in_stack_ffffffffffffff4c);
  prefix = (string *)local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_89 + 1),"ode",(allocator *)prefix);
  amrex::ParmParse::ParmParse(in_stack_ffffffffffffff60,prefix);
  std::__cxx11::string::~string((string *)(local_89 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_89);
  amrex::ParmParse::query
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(int *)in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffcc);
  amrex::ParmParse::query
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffcc);
  amrex::ParmParse::query
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(int *)in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffcc);
  amrex::ParmParse::query
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(int *)in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffcc);
  amrex::ParmParse::query
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(int *)in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffcc);
  amrex::ParmParse::query
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(bool *)in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffcc);
  amrex::ParmParse::~ParmParse((ParmParse *)0x239636);
  return 0;
}

Assistant:

int
ReactorRK64::init(int reactor_type, int /*ncells*/)
{
  BL_PROFILE("Pele::ReactorRK64::init()");
  m_reactor_type = reactor_type;
  ReactorTypes::check_reactor_type(m_reactor_type);
  amrex::ParmParse pp("ode");
  pp.query("verbose", verbose);
  pp.query("atol", absTol);
  pp.query("rk64_nsubsteps_guess", rk64_nsubsteps_guess);
  pp.query("rk64_nsubsteps_min", rk64_nsubsteps_min);
  pp.query("rk64_nsubsteps_max", rk64_nsubsteps_max);
  pp.query("clean_init_massfrac", m_clean_init_massfrac);
  return (0);
}